

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sieve.hpp
# Opt level: O2

void __thiscall
primecount::Sieve::pre_sieve<int>
          (Sieve *this,Vector<int,_std::allocator<int>_> *primes,uint64_t c,uint64_t low,
          uint64_t high)

{
  uint64_t i;
  uint64_t i_00;
  
  reset_sieve(this,low,high);
  for (i_00 = 4; i_00 <= c; i_00 = i_00 + 1) {
    cross_off(this,(long)primes->array_[i_00],i_00);
  }
  init_counter(this,low,high);
  return;
}

Assistant:

void pre_sieve(const Vector<T>& primes, uint64_t c, uint64_t low, uint64_t high)
  {
    reset_sieve(low, high);
    for (uint64_t i = 4; i <= c; i++)
      cross_off(primes[i], i);

    init_counter(low, high);
  }